

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadTRIS(B3DImporter *this,int v0)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  __uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true> this_00;
  ulong *puVar6;
  aiFace *paVar7;
  uint *puVar8;
  uint uVar9;
  B3DImporter *pBVar10;
  uint uVar11;
  ulong uVar12;
  aiFace *paVar13;
  allocator<char> local_79;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  undefined1 local_70 [64];
  
  uVar1 = ReadInt(this);
  if (uVar1 == 0xffffffff) {
    uVar1 = 0;
  }
  else if (((int)uVar1 < 0) ||
          ((int)((ulong)((long)(this->_materials).
                               super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_materials).
                              super__Vector_base<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar1)) {
    pBVar10 = (B3DImporter *)(local_70 + 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pBVar10,"Bad material id",(allocator<char> *)&mesh);
    Fail(pBVar10,(string *)(local_70 + 0x20));
  }
  this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)operator_new(0x520);
  aiMesh::aiMesh((aiMesh *)
                 this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  *(uint *)((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe8) = uVar1;
  *(uint *)((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)
   this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = 4;
  uVar1 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] - this->_pos;
  uVar12 = (ulong)uVar1 / 0xc;
  mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
       super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  puVar6 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
  *puVar6 = uVar12;
  paVar13 = (aiFace *)(puVar6 + 1);
  if (0xb < uVar1) {
    paVar7 = paVar13;
    do {
      paVar7->mNumIndices = 0;
      paVar7->mIndices = (uint *)0x0;
      paVar7 = paVar7 + 1;
    } while (paVar7 != paVar13 + uVar12);
  }
  *(aiFace **)
   ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
          super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = paVar13;
  while( true ) {
    iVar2 = (int)uVar12;
    uVar12 = (ulong)(iVar2 - 1);
    if (iVar2 == 0) {
      std::
      vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
      ::emplace_back<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>
                ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
                  *)&this->_meshes,&mesh);
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&mesh);
      return;
    }
    iVar2 = ReadInt(this);
    iVar3 = ReadInt(this);
    iVar4 = ReadInt(this);
    uVar1 = iVar2 + v0;
    if ((int)uVar1 < 0) break;
    uVar5 = (uint)(((long)(this->_vertices).
                          super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_vertices).
                         super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x38);
    if (((((int)uVar5 <= (int)uVar1) || (uVar11 = iVar3 + v0, (int)uVar11 < 0)) || (uVar5 <= uVar11)
        ) || ((uVar9 = iVar4 + v0, (int)uVar9 < 0 || (uVar5 <= uVar9)))) break;
    paVar13->mNumIndices = 3;
    puVar8 = (uint *)operator_new__(0xc);
    paVar13->mIndices = puVar8;
    *puVar8 = uVar1;
    puVar8[1] = uVar11;
    puVar8[2] = uVar9;
    *(int *)((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) =
         *(int *)((long)mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) + 1;
    paVar13 = paVar13 + 1;
  }
  pBVar10 = (B3DImporter *)local_70;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pBVar10,"Bad triangle index",&local_79);
  Fail(pBVar10,(string *)local_70);
}

Assistant:

void B3DImporter::ReadTRIS( int v0 ){
    int matid=ReadInt();
    if( matid==-1 ){
        matid=0;
    }else if( matid<0 || matid>=(int)_materials.size() ){
#ifdef DEBUG_B3D
        cout<<"material id="<<matid<<endl;
#endif
        Fail( "Bad material id" );
    }

    std::unique_ptr<aiMesh> mesh(new aiMesh);

    mesh->mMaterialIndex=matid;
    mesh->mNumFaces=0;
    mesh->mPrimitiveTypes=aiPrimitiveType_TRIANGLE;

    int n_tris=ChunkSize()/12;
    aiFace *face=mesh->mFaces=new aiFace[n_tris];

    for( int i=0;i<n_tris;++i ){
        int i0=ReadInt()+v0;
        int i1=ReadInt()+v0;
        int i2=ReadInt()+v0;
        if( i0<0 || i0>=(int)_vertices.size() || i1<0 || i1>=(int)_vertices.size() || i2<0 || i2>=(int)_vertices.size() ){
#ifdef DEBUG_B3D
            cout<<"Bad triangle index: i0="<<i0<<", i1="<<i1<<", i2="<<i2<<endl;
#endif
            Fail( "Bad triangle index" );
            continue;
        }
        face->mNumIndices=3;
        face->mIndices=new unsigned[3];
        face->mIndices[0]=i0;
        face->mIndices[1]=i1;
        face->mIndices[2]=i2;
        ++mesh->mNumFaces;
        ++face;
    }

    _meshes.emplace_back( std::move(mesh) );
}